

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar.c
# Opt level: O3

void horizontalHaar(uint8_t *_src,uint8_t *_dst,int rows,int cols)

{
  short sVar1;
  short sVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  ulong uVar6;
  uint uVar7;
  short sVar8;
  undefined2 uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint8_t *puVar13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 in_ZMM2 [64];
  
  auVar4 = _DAT_0010b5c0;
  if (rows != 0) {
    uVar6 = (ulong)cols;
    uVar7 = cols & 0xffffffe0;
    uVar12 = (ulong)(int)(cols - 1U);
    lVar14 = 0;
    puVar13 = _dst;
    do {
      lVar5 = lVar14 * uVar6;
      if (uVar7 != 0) {
        uVar11 = 0;
        do {
          auVar3 = vphsubw_avx2(in_ZMM2._0_32_,
                                *(undefined1 (*) [32])(_src + uVar11 * 2 + lVar5 * 2 + 0x20),
                                *(undefined1 (*) [32])(_src + uVar11 * 2 + lVar5 * 2));
          auVar15 = vphaddw_avx2(*(undefined1 (*) [32])(_src + uVar11 * 2 + lVar5 * 2 + 0x20),
                                 *(undefined1 (*) [32])(_src + uVar11 * 2 + lVar5 * 2));
          auVar15 = vpsraw_avx2(auVar15,1);
          auVar15 = vpermd_avx2(auVar4,auVar15);
          auVar3 = vpermd_avx2(auVar4,auVar3);
          in_ZMM2 = ZEXT3264(auVar3);
          *(undefined1 (*) [32])(puVar13 + uVar11) = auVar15;
          *(undefined1 (*) [32])(puVar13 + uVar11 + (long)(cols / 2) * 2) = auVar3;
          uVar11 = uVar11 + 0x20;
        } while ((long)(int)uVar7 != uVar11);
      }
      if (uVar7 < cols - 1U) {
        uVar11 = (long)(int)uVar7;
        do {
          sVar1 = *(short *)(_src + uVar11 * 2 + lVar5 * 2 + 2);
          sVar2 = *(short *)(_src + uVar11 * 2 + lVar5 * 2);
          sVar8 = sVar2 + sVar1;
          uVar10 = (uint)sVar8;
          if (sVar8 < 0) {
            uVar9 = (undefined2)((int)((uVar10 - ((int)(uVar10 - 1) >> 0x1f)) + -1) >> 1);
          }
          else {
            uVar9 = (undefined2)(uVar10 >> 1);
          }
          *(undefined2 *)(_dst + uVar11 + lVar5 * 2) = uVar9;
          *(short *)(_dst + uVar11 + (long)(cols / 2) * 2 + lVar5 * 2) = sVar2 - sVar1;
          uVar11 = uVar11 + 2;
        } while (uVar11 < uVar12);
      }
      if ((uVar6 & 1) != 0) {
        *(undefined2 *)(_dst + uVar12 * 2 + lVar5 * 2) =
             *(undefined2 *)(_src + uVar12 * 2 + lVar5 * 2);
      }
      lVar14 = lVar14 + 1;
      puVar13 = puVar13 + uVar6 * 2;
    } while (lVar14 != rows);
  }
  return;
}

Assistant:

void horizontalHaar(const uint8_t* IMAGESTEGO_RESTRICT _src, uint8_t* IMAGESTEGO_RESTRICT _dst, const int rows,
        const int cols) {
    __m256i mask = _mm256_set_epi32(5, 4, 1, 0, 7, 6, 3, 2);
    const int16_t* src = (const int16_t*) _src;
    int16_t* dst = (int16_t*) _dst;
    for (size_t row = 0; row < rows; ++row) {
        const int16_t* sptr = src + row * cols;
        int16_t* dptr = dst + row * cols;
        const int aligned = align32(cols);
        for (size_t col = 0; col != aligned; col += 32) {
            int16_t* tmp1 = dptr + col / 2, * tmp2 = tmp1 + cols / 2;
#if IMAGESTEGO_GCC || IMAGESTEGO_CLANG || IMAGESTEGO_ICC
            asm(
                "vmovdqu (%[src], %[col], 2), %%ymm0  \n\t"
                "vmovdqu 32(%[src], %[col], 2), %%ymm1\n\t"
                "vphsubw %%ymm0, %%ymm1, %%ymm2       \n\t"
                "vphaddw %%ymm0, %%ymm1, %%ymm1       \n\t"
                "vpsraw  $0x1, %%ymm1, %%ymm1         \n\t"
                "vpermd  %%ymm1, %[mask], %%ymm1      \n\t"
                "vpermd  %%ymm2, %[mask], %%ymm2      \n\t"
                "vmovdqu %%ymm1, (%[lo])              \n\t"
                "vmovdqu %%ymm2, (%[hi])              \n\t"
                :
                : [lo]   "r" (tmp1),
                  [hi]   "r" (tmp2),
                  [src]  "r" (sptr),
                  [mask] "x" (mask),
                  [col]  "r" ((ptrdiff_t) col)
                : "%ymm0", "%ymm1", "%ymm2", "memory"
            );
#else // MSVC doesn't support inline asm for x64
            const __m256i a = _mm256_loadu_si256((const __m256i*) (src + col)),
                          b = _mm256_loadu_si256((const __m256i*) (src + col + 16));
            const __m256i lo = _mm256_srai_epi16(_mm256_hadd_epi16(b, a), 1),
                          hi = _mm256_hsub_epi16(b, a);
            _mm256_storeu_si256((__m256i*) tmp1, _mm256_permutevar8x32_epi32(lo, mask));
            _mm256_storeu_si256((__m256i*) tmp2, _mm256_permutevar8x32_epi32(hi, mask));
#endif
        }
        // TODO: implement with AVX512 if possible
        for (size_t col = aligned; col < cols - 1; col += 2) {
            *(dptr + col / 2) = floor2(sptr[col + 1] + sptr[col]);
            *(dptr + cols / 2 + col / 2) = sptr[col] - sptr[col + 1];
        }
        if (cols % 2 != 0) {
            dptr[cols - 1] = sptr[cols - 1];
        }
    }
}